

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_process_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  char *argv [3];
  size_t exepath_size;
  uv_process_options_t options;
  uv_process_t h;
  char exepath [256];
  undefined1 auStack_288 [120];
  code *pcStack_210;
  undefined1 *local_208;
  char *pcStack_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined1 *puStack_1e0;
  undefined1 *local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a0 [136];
  undefined1 local_118 [264];
  
  local_1f8 = 0;
  local_208 = (undefined1 *)0x0;
  pcStack_200 = "spawn_helper4";
  local_1e8 = 0;
  puStack_1e0 = (undefined1 *)0x0;
  local_1d8 = (undefined1 *)0x0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1f0 = 0x100;
  puVar3 = local_118;
  pcStack_210 = (code *)0x169f5c;
  iVar1 = uv_exepath(puVar3);
  if (iVar1 == 0) {
    local_1e8 = 0;
    pcStack_210 = (code *)0x169f83;
    local_208 = puVar3;
    puStack_1e0 = puVar3;
    local_1d8 = (undefined1 *)&local_208;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x169f93;
    iVar1 = uv_spawn(uVar2,local_1a0,&local_1e8);
    if (iVar1 != 0) goto LAB_0016a014;
    puVar3 = local_1a0;
    pcStack_210 = (code *)0x169fa4;
    uv_unref(puVar3);
    pcStack_210 = (code *)0x169fa9;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x169fb3;
    uv_run(uVar2,0);
    pcStack_210 = (code *)0x169fc0;
    iVar1 = uv_process_kill(puVar3,0xf);
    if (iVar1 != 0) goto LAB_0016a019;
    pcStack_210 = (code *)0x169fce;
    do_close(local_1a0);
    pcStack_210 = (code *)0x169fd3;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_210 = (code *)0x169fe7;
    uv_walk(puVar3,close_walk_cb,0);
    pcStack_210 = (code *)0x169ff1;
    uv_run(puVar3,0);
    pcStack_210 = (code *)0x169ff6;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x169ffe;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_210 = (code *)0x16a014;
    run_test_process_ref_cold_1();
LAB_0016a014:
    pcStack_210 = (code *)0x16a019;
    run_test_process_ref_cold_2();
LAB_0016a019:
    pcStack_210 = (code *)0x16a01e;
    run_test_process_ref_cold_3();
  }
  pcStack_210 = run_test_has_ref;
  run_test_process_ref_cold_4();
  pcStack_210 = (code *)puVar3;
  uVar2 = uv_default_loop();
  puVar3 = auStack_288;
  uv_idle_init(uVar2,puVar3);
  uv_ref(puVar3);
  iVar1 = uv_has_ref(puVar3);
  if (iVar1 == 1) {
    puVar3 = auStack_288;
    uv_unref(puVar3);
    iVar1 = uv_has_ref(puVar3);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      puVar3 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016a0b7;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_0016a0b7:
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT(r == 0);

  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}